

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMap<int,_QVariant>_>::reallocate
          (QMovableArrayOps<QMap<int,_QVariant>_> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QMap<int,_QVariant>_>_*,_QMap<int,_QVariant>_*> pVar1;
  
  pVar1 = QTypedArrayData<QMap<int,_QVariant>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
                     super_QArrayDataPointer<QMap<int,_QVariant>_>.d,
                     (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
                     super_QArrayDataPointer<QMap<int,_QVariant>_>.ptr,alloc,option);
  if (pVar1.second != (QMap<int,_QVariant> *)0x0) {
    (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
    super_QArrayDataPointer<QMap<int,_QVariant>_>.d = pVar1.first;
    (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
    super_QArrayDataPointer<QMap<int,_QVariant>_>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }